

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::TextBasedObject::Copy(TextBasedObject *this,TextBasedObject *rhs)

{
  undefined8 uVar1;
  
  DescriptiveObject::Copy(&this->super_DescriptiveObject,&rhs->super_DescriptiveObject);
  (this->PayloadSchemeID).super_Identifier<16U>.m_HasValue =
       (rhs->PayloadSchemeID).super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)((rhs->PayloadSchemeID).super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->PayloadSchemeID).super_Identifier<16U>.m_Value =
       *(undefined8 *)(rhs->PayloadSchemeID).super_Identifier<16U>.m_Value;
  *(undefined8 *)((this->PayloadSchemeID).super_Identifier<16U>.m_Value + 8) = uVar1;
  std::__cxx11::string::_M_assign((string *)&(this->TextMIMEMediaType).super_string);
  std::__cxx11::string::_M_assign((string *)&(this->RFC5646TextLanguageCode).super_string);
  optional_property<ASDCP::MXF::UTF16String>::operator=
            (&this->TextDataDescription,&rhs->TextDataDescription);
  return;
}

Assistant:

void
TextBasedObject::Copy(const TextBasedObject& rhs)
{
  DescriptiveObject::Copy(rhs);
  PayloadSchemeID = rhs.PayloadSchemeID;
  TextMIMEMediaType = rhs.TextMIMEMediaType;
  RFC5646TextLanguageCode = rhs.RFC5646TextLanguageCode;
  TextDataDescription = rhs.TextDataDescription;
}